

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

DecodeRawTransactionResponseStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionResponse::ConvertToStruct
          (DecodeRawTransactionResponseStruct *__return_storage_ptr__,
          DecodeRawTransactionResponse *this)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  local_58;
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  local_38;
  
  (__return_storage_ptr__->txid)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->txid).field_2
  ;
  (__return_storage_ptr__->txid)._M_string_length = 0;
  (__return_storage_ptr__->txid).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->hash)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hash).field_2
  ;
  (__return_storage_ptr__->hash)._M_string_length = 0;
  (__return_storage_ptr__->hash).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->version = 0;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->vsize = 0;
  __return_storage_ptr__->weight = 0;
  __return_storage_ptr__->locktime = 0;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hash);
  uVar2 = this->size_;
  uVar3 = this->vsize_;
  uVar4 = this->weight_;
  __return_storage_ptr__->version = this->version_;
  __return_storage_ptr__->size = uVar2;
  __return_storage_ptr__->vsize = uVar3;
  __return_storage_ptr__->weight = uVar4;
  __return_storage_ptr__->locktime = this->locktime_;
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
  ::ConvertToStruct(&local_58,&this->vin_);
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->vin).
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->vin).
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->vin).
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vin).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::~vector(&local_38);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::~vector(&local_58);
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
  ::ConvertToStruct((vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
                     *)&local_58,&this->vout_);
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->vout).
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_58.
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->vout).
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->vout).
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_58.
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vout).
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_58.
                super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::~vector((vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
             *)&local_38);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::~vector((vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
             *)&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionResponseStruct DecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}